

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotBarsEx<ImPlot::GetterXsYs<float>>
               (char *label_id,GetterXsYs<float> *getter,double width)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  float *pfVar8;
  float *pfVar9;
  ImPlotPlot *pIVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  bool bVar13;
  ImU32 col;
  ImU32 col_00;
  long lVar14;
  ImDrawList *this;
  int iVar15;
  int iVar16;
  int iVar17;
  ImPlotRange *pIVar18;
  double dVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar13 = BeginItem(label_id,1);
  pIVar12 = GImPlot;
  if (bVar13) {
    dVar24 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar15 = getter->Count, 0 < iVar15)) {
      pfVar8 = getter->Xs;
      pfVar9 = getter->Ys;
      iVar16 = getter->Offset;
      iVar4 = getter->Stride;
      pIVar10 = GImPlot->CurrentPlot;
      iVar5 = pIVar10->CurrentYAxis;
      uVar6 = (pIVar10->XAxis).Flags;
      pIVar18 = GImPlot->ExtentsY + iVar5;
      uVar7 = pIVar10->YAxis[iVar5].Flags;
      iVar17 = 0;
      do {
        lVar14 = (long)(((iVar16 + iVar17) % iVar15 + iVar15) % iVar15) * (long)iVar4;
        dVar19 = (double)*(float *)((long)pfVar8 + lVar14);
        fVar1 = *(float *)((long)pfVar9 + lVar14);
        dVar11 = (double)fVar1;
        dVar22 = dVar19 - dVar24;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar22) < 0x7ff0000000000000) {
LAB_001f83f4:
            if ((0.0 < dVar22) || ((uVar6 & 0x20) == 0)) {
              dVar2 = (pIVar12->ExtentsX).Min;
              dVar23 = dVar22;
              if (dVar2 <= dVar22) {
                dVar23 = dVar2;
              }
              (pIVar12->ExtentsX).Min = dVar23;
              dVar2 = (pIVar12->ExtentsX).Max;
              dVar23 = dVar22;
              if (dVar22 <= dVar2) {
                dVar23 = dVar2;
              }
              (pIVar12->ExtentsX).Max = dVar23;
            }
          }
        }
        else if ((((long)ABS(dVar22) < 0x7ff0000000000000) &&
                 (pIVar10->YAxis[iVar5].Range.Min <= dVar11)) &&
                (dVar11 <= pIVar10->YAxis[iVar5].Range.Max)) goto LAB_001f83f4;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((long)ABS(dVar11) < 0x7ff0000000000000) {
LAB_001f8467:
            if ((0.0 < fVar1) || ((uVar7 & 0x20) == 0)) {
              dVar22 = dVar11;
              if (pIVar18->Min <= dVar11) {
                dVar22 = pIVar18->Min;
              }
              pIVar18->Min = dVar22;
              dVar22 = pIVar12->ExtentsY[iVar5].Max;
              if (dVar11 <= dVar22) {
                dVar11 = dVar22;
              }
              pIVar12->ExtentsY[iVar5].Max = dVar11;
            }
          }
        }
        else if ((((long)ABS(dVar11) < 0x7ff0000000000000) && ((pIVar10->XAxis).Range.Min <= dVar22)
                 ) && (dVar22 <= (pIVar10->XAxis).Range.Max)) goto LAB_001f8467;
        dVar19 = dVar19 + dVar24;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar19) < 0x7ff0000000000000) {
LAB_001f84c6:
            if ((0.0 < dVar19) || ((uVar6 & 0x20) == 0)) {
              dVar11 = (pIVar12->ExtentsX).Min;
              dVar22 = dVar19;
              if (dVar11 <= dVar19) {
                dVar22 = dVar11;
              }
              (pIVar12->ExtentsX).Min = dVar22;
              dVar11 = (pIVar12->ExtentsX).Max;
              dVar22 = dVar19;
              if (dVar19 <= dVar11) {
                dVar22 = dVar11;
              }
              (pIVar12->ExtentsX).Max = dVar22;
            }
          }
        }
        else if ((((long)ABS(dVar19) < 0x7ff0000000000000) &&
                 (pIVar10->YAxis[iVar5].Range.Min <= 0.0)) &&
                (0.0 <= pIVar10->YAxis[iVar5].Range.Max)) goto LAB_001f84c6;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((uVar7 & 0x20) == 0) {
LAB_001f852c:
            uVar20 = 0;
            uVar21 = 0;
            dVar19 = pIVar18->Min;
            if (dVar19 <= 0.0) {
              uVar20 = SUB84(dVar19,0);
              uVar21 = (undefined4)((ulong)dVar19 >> 0x20);
            }
            pIVar18->Min = (double)CONCAT44(uVar21,uVar20);
            uVar20 = 0;
            uVar21 = 0;
            dVar19 = pIVar12->ExtentsY[iVar5].Max;
            if (0.0 <= dVar19) {
              uVar20 = SUB84(dVar19,0);
              uVar21 = (undefined4)((ulong)dVar19 >> 0x20);
            }
            pIVar12->ExtentsY[iVar5].Max = (double)CONCAT44(uVar21,uVar20);
          }
        }
        else if ((((uVar7 & 0x20) == 0) && ((pIVar10->XAxis).Range.Min <= dVar19)) &&
                (dVar19 <= (pIVar10->XAxis).Range.Max)) goto LAB_001f852c;
        iVar17 = iVar17 + 1;
      } while (iVar15 != iVar17);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar12->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar12->NextItemData).Colors + 1);
    iVar15 = getter->Count;
    if (0 < iVar15) {
      bVar13 = (pIVar12->NextItemData).RenderFill;
      bVar3 = (pIVar12->NextItemData).RenderLine;
      iVar16 = 0;
      do {
        lVar14 = (long)(((getter->Offset + iVar16) % iVar15 + iVar15) % iVar15) *
                 (long)getter->Stride;
        fVar1 = *(float *)((long)getter->Ys + lVar14);
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          dVar19 = (double)*(float *)((long)getter->Xs + lVar14);
          local_38 = PlotToPixels(dVar19 - dVar24,(double)fVar1,-1);
          local_40 = PlotToPixels(dVar19 + dVar24,0.0,-1);
          if ((pIVar12->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar13 ^ 1U | col != col_00) & bVar3) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar12->NextItemData).LineWeight);
          }
        }
        iVar16 = iVar16 + 1;
        iVar15 = getter->Count;
      } while (iVar16 < iVar15);
    }
    pIVar12 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar12->NextItemData);
    pIVar12->PreviousItem = pIVar12->CurrentItem;
    pIVar12->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}